

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O2

void Gia_ManQuantCollect_rec
               (Gia_Man_t *p,int iObj,Vec_Int_t *vQuantCis,Vec_Int_t *vQuantSide,
               Vec_Int_t *vQuantAnds)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *p_00;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    iVar1 = Gia_ManQuantCheckOverlap(p,iObj);
    p_00 = vQuantSide;
    if (iVar1 != 0) {
      pGVar2 = Gia_ManObj(p,iObj);
      p_00 = vQuantCis;
      if ((~(uint)*(undefined8 *)pGVar2 & 0x9fffffff) != 0) {
        Gia_ManQuantCollect_rec
                  (p,iObj - ((uint)*(undefined8 *)pGVar2 & 0x1fffffff),vQuantCis,vQuantSide,
                   vQuantAnds);
        Gia_ManQuantCollect_rec
                  (p,iObj - (*(uint *)&pGVar2->field_0x4 & 0x1fffffff),vQuantCis,vQuantSide,
                   vQuantAnds);
        p_00 = vQuantAnds;
      }
    }
    Vec_IntPush(p_00,iObj);
    return;
  }
  return;
}

Assistant:

void Gia_ManQuantCollect_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vQuantCis, Vec_Int_t * vQuantSide, Vec_Int_t * vQuantAnds )
{
    Gia_Obj_t * pObj; 
    if ( Gia_ObjIsTravIdCurrentId( p, iObj ) )
        return;
    Gia_ObjSetTravIdCurrentId( p, iObj );
    if ( !Gia_ManQuantCheckOverlap(p, iObj) )
    {
        Vec_IntPush( vQuantSide, iObj );
        return;
    }
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vQuantCis, iObj );
        return;
    }
    Gia_ManQuantCollect_rec( p, Gia_ObjFaninId0(pObj, iObj), vQuantCis, vQuantSide, vQuantAnds );
    Gia_ManQuantCollect_rec( p, Gia_ObjFaninId1(pObj, iObj), vQuantCis, vQuantSide, vQuantAnds );
    Vec_IntPush( vQuantAnds, iObj );
}